

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zeEventGetEventPool(ze_event_handle_t hEvent,ze_event_pool_handle_t *phEventPool)

{
  ze_event_pool_handle_t p_Var1;
  ze_pfnEventGetEventPool_t pfnGetEventPool;
  ze_result_t result;
  ze_event_pool_handle_t *phEventPool_local;
  ze_event_handle_t hEvent_local;
  
  pfnGetEventPool._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c610 == (code *)0x0) {
    p_Var1 = (ze_event_pool_handle_t)context_t::get((context_t *)&context);
    *phEventPool = p_Var1;
  }
  else {
    pfnGetEventPool._4_4_ = (*DAT_0011c610)(hEvent,phEventPool);
  }
  return pfnGetEventPool._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeEventGetEventPool(
        ze_event_handle_t hEvent,                       ///< [in] handle of the event
        ze_event_pool_handle_t* phEventPool             ///< [out] handle of the event pool for the event
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetEventPool = context.zeDdiTable.Event.pfnGetEventPool;
        if( nullptr != pfnGetEventPool )
        {
            result = pfnGetEventPool( hEvent, phEventPool );
        }
        else
        {
            // generic implementation
            *phEventPool = reinterpret_cast<ze_event_pool_handle_t>( context.get() );

        }

        return result;
    }